

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

size_t __thiscall
google::protobuf::internal::DynamicMapField::SpaceUsedExcludingSelfNoLock(DynamicMapField *this)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  size_type sVar2;
  CppType CVar3;
  int iVar4;
  Rep *pRVar5;
  long lVar6;
  Message *pMVar7;
  undefined4 extraout_var;
  long lVar8;
  size_t sVar9;
  long lVar10;
  const_iterator it;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_50;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_38;
  
  pRVar1 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  if (pRVar1 == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    sVar9 = 0x18;
  }
  else {
    lVar8 = (long)(pRVar1->super_RepeatedPtrFieldBase).total_size_ << 3;
    pRVar5 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
    if (pRVar5 != (Rep *)0x0) {
      if (0 < pRVar5->allocated_size) {
        lVar10 = 0;
        do {
          lVar6 = (**(code **)(*pRVar5->elements[lVar10] + 0xa0))();
          lVar8 = lVar8 + lVar6;
          lVar10 = lVar10 + 1;
          pRVar5 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
        } while (lVar10 < pRVar5->allocated_size);
      }
      lVar8 = lVar8 + 8;
    }
    sVar9 = lVar8 + 0x18;
  }
  local_38.m_ = (this->map_).elements_;
  sVar2 = (local_38.m_)->num_elements_;
  if (sVar2 != 0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::SearchFrom(&local_38,(local_38.m_)->index_of_first_non_null_);
    local_50.node_ = local_38.node_;
    local_50.m_ = local_38.m_;
    local_50.bucket_index_ = local_38.bucket_index_;
    lVar10 = sVar2 * 0x20;
    CVar3 = MapKey::type(&(((local_38.node_)->kv).v_)->first);
    lVar8 = 0;
    if (CVar3 == CPPTYPE_STRING) {
      lVar8 = lVar10;
    }
    sVar9 = lVar8 + sVar9 + lVar10;
    CVar3 = MapValueRef::type(&(((local_50.node_)->kv).v_)->second);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
      sVar9 = sVar9 + sVar2 * 4;
      break;
    case CPPTYPE_INT64:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
      sVar9 = sVar9 + sVar2 * 8;
      break;
    case CPPTYPE_BOOL:
      sVar9 = sVar9 + sVar2;
      break;
    case CPPTYPE_STRING:
      sVar9 = sVar9 + lVar10;
      break;
    case CPPTYPE_MESSAGE:
      if (local_50.node_ != (Node *)0x0) {
        do {
          pMVar7 = MapValueRef::GetMessageValue(&(((local_50.node_)->kv).v_)->second);
          iVar4 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[0x16])(pMVar7);
          lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                            ((long *)CONCAT44(extraout_var,iVar4),pMVar7);
          sVar9 = sVar9 + lVar8;
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
          iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
          ::operator++(&local_50);
        } while (local_50.node_ != (Node *)0x0);
      }
    }
  }
  return sVar9;
}

Assistant:

size_t DynamicMapField::SpaceUsedExcludingSelfNoLock() const {
  size_t size = 0;
  if (MapFieldBase::repeated_field_ != NULL) {
    size += MapFieldBase::repeated_field_->SpaceUsedExcludingSelfLong();
  }
  size += sizeof(map_);
  size_t map_size = map_.size();
  if (map_size) {
    Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
    size += sizeof(it->first) * map_size;
    size += sizeof(it->second) * map_size;
    // If key is string, add the allocated space.
    if (it->first.type() == google::protobuf::FieldDescriptor::CPPTYPE_STRING) {
      size += sizeof(string) * map_size;
    }
    // Add the allocated space in MapValueRef.
    switch (it->second.type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                              \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        size += sizeof(TYPE) * map_size;                        \
        break;                                                  \
      }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        while (it != map_.end()) {
          const Message& message = it->second.GetMessageValue();
          size += message.GetReflection()->SpaceUsedLong(message);
          ++it;
        }
        break;
      }
    }
  }
  return size;
}